

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.h
# Opt level: O2

void __thiscall wasm::IRBuilder::IRBuilder(IRBuilder *this,Module *wasm)

{
  this->wasm = wasm;
  this->func = (Function *)0x0;
  (this->builder).wasm = wasm;
  *(__index_type *)
   ((long)&(this->debugLoc).
           super__Variant_base<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
           .
           super__Move_assign_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
           .
           super__Copy_assign_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
           .
           super__Move_ctor_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
           .
           super__Copy_ctor_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
           .
           super__Variant_storage_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
   + 0x14) = '\0';
  (this->scopeStack).
  super__Vector_base<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->scopeStack).
  super__Vector_base<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->scopeStack).
  super__Vector_base<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->binaryPos = (size_t *)0x0;
  this->lastBinaryPos = 0;
  this->codeSectionOffset = 0;
  (this->labelDepths)._M_h._M_buckets = &(this->labelDepths)._M_h._M_single_bucket;
  (this->labelDepths)._M_h._M_bucket_count = 1;
  (this->labelDepths)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->labelDepths)._M_h._M_element_count = 0;
  (this->labelDepths)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->labelDepths)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->labelDepths)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->blockHint = 0;
  this->labelHint = 0;
  return;
}

Assistant:

IRBuilder(Module& wasm) : wasm(wasm), builder(wasm) {}